

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O1

int __thiscall adjMaxtrix<char>::GetFirstVex(adjMaxtrix<char> *this,int v)

{
  ulong uVar1;
  ulong uVar2;
  
  if (-1 < v) {
    uVar2 = (long)(this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->vexs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if ((uint)v < uVar2) {
      uVar1 = 0;
      do {
        if (this->edge[(uint)v][uVar1] != this->MAX_WEIGHT) goto LAB_00102ce4;
        uVar1 = uVar1 + 1;
      } while (uVar2 != uVar1);
      goto LAB_00102cdf;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_2993,0x25)
  ;
LAB_00102cdf:
  uVar1 = 0xffffffff;
LAB_00102ce4:
  return (int)uVar1;
}

Assistant:

int adjMaxtrix<dataType>::GetFirstVex(int v) {
	int col;
	if (v < 0 || v >= vexs.size()) {
		cout << "取第一个邻接顶点参数v越界";
		return -1;
	}
	//查找v顶点的，也就是第v行的第一个有效顶点，放回其列col
	for (col = 0; col < vexs.size(); col++) {
		if (edge[v][col] != MAX_WEIGHT)
			return col;
	}
	return -1;
}